

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_37229c::CliqueRunner::colour_class_order
          (CliqueRunner *this,SVOBitset *p,int *p_order,int *p_bounds,int *p_end)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  SVOBitset p_left;
  SVOBitset q;
  anon_union_128_2_84168a9f_for__data local_140;
  uint local_c0;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  gss::innards::SVOBitset::SVOBitset((SVOBitset *)&local_140,p);
  *p_end = 0;
  bVar4 = gss::innards::SVOBitset::any((SVOBitset *)&local_140);
  if (bVar4) {
    iVar10 = 0;
    do {
      if ((ulong)local_c0 < 0x11) {
        local_38 = local_c0;
        local_b8.long_data = local_140.long_data;
        local_b8.short_data[1] = local_140.short_data[1];
        local_b8.short_data[2] = local_140.short_data[2];
        local_b8.short_data[3] = local_140.short_data[3];
        local_b8.short_data[4] = local_140.short_data[4];
        local_b8.short_data[5] = local_140.short_data[5];
        local_b8.short_data[6] = local_140.short_data[6];
        local_b8.short_data[7] = local_140.short_data[7];
        local_b8.short_data[8] = local_140.short_data[8];
        local_b8.short_data[9] = local_140.short_data[9];
        local_b8.short_data[10] = local_140.short_data[10];
        local_b8.short_data[0xb] = local_140.short_data[0xb];
        local_b8.short_data[0xc] = local_140.short_data[0xc];
        local_b8.short_data[0xd] = local_140.short_data[0xd];
        local_b8.short_data[0xe] = local_140.short_data[0xe];
        local_b8.short_data[0xf] = local_140.short_data[0xf];
      }
      else {
        local_38 = local_c0;
        uVar9 = (ulong)local_c0 << 3;
        local_b8.long_data = (BitWord *)operator_new__(uVar9);
        memmove(local_b8.long_data,local_140.long_data,uVar9);
      }
      iVar10 = iVar10 + 1;
      while (bVar4 = gss::innards::SVOBitset::any((SVOBitset *)&local_b8), uVar3 = local_38, bVar4)
      {
        uVar9 = (ulong)local_38;
        uVar6 = &local_b8;
        if (0x10 < uVar9) {
          uVar6 = local_b8.long_data;
        }
        iVar8 = -1;
        if (uVar9 != 0) {
          lVar7 = 0;
LAB_001721e4:
          uVar1 = *(ulong *)uVar6;
          if (uVar1 == 0) goto code_r0x001721ec;
          iVar8 = 0;
          for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          iVar8 = iVar8 - (int)lVar7;
        }
LAB_00172206:
        uVar6 = &local_140;
        if (0x10 < local_c0) {
          uVar6 = local_140.long_data;
        }
        bVar2 = (byte)iVar8 & 0x3f;
        uVar9 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
        iVar5 = iVar8 + 0x3f;
        if (-1 < iVar8) {
          iVar5 = iVar8;
        }
        *(ulong *)(uVar6 + (long)(iVar5 >> 6) * 8) =
             *(ulong *)(uVar6 + (long)(iVar5 >> 6) * 8) & uVar9;
        uVar6 = &local_b8;
        if (0x10 < uVar3) {
          uVar6 = local_b8.long_data;
        }
        *(ulong *)(uVar6 + (long)(iVar5 >> 6) * 8) =
             *(ulong *)(uVar6 + (long)(iVar5 >> 6) * 8) & uVar9;
        gss::innards::SVOBitset::intersect_with_complement
                  ((SVOBitset *)&local_b8,
                   (this->adj).
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar8);
        p_bounds[*p_end] = iVar10;
        p_order[*p_end] = iVar8;
        *p_end = *p_end + 1;
      }
      if ((0x10 < local_38) &&
         ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
          (anon_union_128_2_84168a9f_for__data *)0x0)) {
        operator_delete__(local_b8.long_data);
      }
      bVar4 = gss::innards::SVOBitset::any((SVOBitset *)&local_140);
    } while (bVar4);
  }
  if ((0x10 < local_c0) &&
     ((anon_union_128_2_84168a9f_for__data *)local_140.short_data[0] !=
      (anon_union_128_2_84168a9f_for__data *)0x0)) {
    operator_delete__(local_140.long_data);
  }
  return;
code_r0x001721ec:
  lVar7 = lVar7 + -0x40;
  uVar6 = uVar6 + 8;
  if (uVar9 * 0x40 + lVar7 == 0) goto LAB_00172206;
  goto LAB_001721e4;
}

Assistant:

auto colour_class_order(
            const SVOBitset & p,
            int * p_order,
            int * p_bounds,
            int & p_end) -> void
        {
            SVOBitset p_left = p; // not coloured yet
            unsigned colour = 0;  // current colour
            p_end = 0;

            // while we've things left to colour
            while (p_left.any()) {
                // next colour
                ++colour;
                // things that can still be given this colour
                SVOBitset q = p_left;

                // while we can still give something this colour
                while (q.any()) {
                    // first thing we can colour
                    int v = q.find_first();
                    p_left.reset(v);
                    q.reset(v);

                    // can't give anything adjacent to this the same colour
                    q.intersect_with_complement(adj[v]);

                    // record in result
                    p_bounds[p_end] = colour;
                    p_order[p_end] = v;
                    ++p_end;
                }
            }
        }